

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v8::detail::report_error(format_func func,int error_code,char *message)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  size_t __size;
  size_t sVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  code *in_RDI;
  memory_buffer full_message;
  allocator<char> *in_stack_fffffffffffffda8;
  buffer<char> *this_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  allocator<char> local_231;
  buffer<char> local_230 [16];
  undefined8 local_18;
  undefined4 local_c;
  code *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<char>::~allocator(&local_231);
  (*local_8)(local_230,local_c,local_18);
  this_00 = local_230;
  this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)buffer<char>::data(this_00);
  __size = buffer<char>::size(this_00);
  sVar1 = fwrite(this,__size,1,_stderr);
  if (sVar1 != 0) {
    fputc(10,_stderr);
  }
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           const char* message) FMT_NOEXCEPT {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  if (std::fwrite(full_message.data(), full_message.size(), 1, stderr) > 0)
    std::fputc('\n', stderr);
}